

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O3

void output_nnybble(char *outfile,int n,uchar *array)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  if (n == 1) goto LAB_001c4c51;
  lVar1 = 0;
  if (bits_to_go2 < 5) {
    output_nybble(outfile,(uint)*array);
    if (n == 2) {
      array = array + 1;
      goto LAB_001c4c51;
    }
    lVar1 = 1;
  }
  iVar6 = (int)lVar1;
  iVar5 = n - iVar6;
  iVar3 = iVar5 / 2;
  iVar2 = bits_to_go2 + -8;
  if (iVar2 == 0) {
    buffer2 = 0;
    lVar4 = -8;
    iVar2 = iVar3;
    if (1 < iVar5) {
      do {
        outfile[noutchar] = array[lVar1 + 1] & 0xf | array[lVar1] << 4;
        lVar1 = lVar1 + 2;
        noutchar = noutchar + 1;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
LAB_001c4c27:
      iVar6 = (int)lVar1;
      lVar4 = (long)(iVar3 * 8 + -8);
    }
  }
  else {
    lVar4 = -8;
    if (1 < iVar5) {
      iVar6 = iVar3;
      do {
        buffer2 = array[lVar1 + 1] & 0xf | (uint)(byte)(array[lVar1] << 4) | buffer2 << 8;
        lVar1 = lVar1 + 2;
        outfile[noutchar] = (char)(buffer2 >> (-(char)iVar2 & 0x1fU));
        noutchar = noutchar + 1;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      goto LAB_001c4c27;
    }
  }
  bitcount = bitcount + lVar4;
  if (iVar6 == n) {
    return;
  }
  array = array + (long)n + -1;
LAB_001c4c51:
  output_nybble(outfile,(uint)*array);
  return;
}

Assistant:

static void output_nnybble(char *outfile, int n, unsigned char array[])
{
	/* pack the 4 lower bits in each element of the array into the outfile array */

int ii, jj, kk = 0, shift;

	if (n == 1) {
		output_nybble(outfile, (int) array[0]);
		return;
	}
/* forcing byte alignment doesn;t help, and even makes it go slightly slower
if (bits_to_go2 != 8)
   output_nbits(outfile, kk, bits_to_go2);
*/
	if (bits_to_go2 <= 4)
	{
		/* just room for 1 nybble; write it out separately */
		output_nybble(outfile, array[0]);
		kk++;  /* index to next array element */

		if (n == 2)  /* only 1 more nybble to write out */
		{
			output_nybble(outfile, (int) array[1]);
			return;
		}
	}


        /* bits_to_go2 is now in the range 5 - 8 */
	shift = 8 - bits_to_go2;  

	/* now write out pairs of nybbles; this does not affect value of bits_to_go2 */
	jj = (n - kk) / 2;
	
	if (bits_to_go2 == 8) {
	    /* special case if nybbles are aligned on byte boundary */
	    /* this actually seems to make very little differnece in speed */
	    buffer2 = 0;
	    for (ii = 0; ii < jj; ii++)
	    {
		outfile[noutchar] = ((array[kk] & 15)<<4) | (array[kk+1] & 15);
		kk += 2;
		noutchar++;
	    }
	} else {
	    for (ii = 0; ii < jj; ii++)
	    {
		buffer2 = (buffer2<<8) | ((array[kk] & 15)<<4) | (array[kk+1] & 15);
		kk += 2;

		/*
		 buffer2 full, put out top 8 bits
		 */

	        outfile[noutchar] = ((buffer2>>shift) & 0xff);
		noutchar++;
	    }
	}

	bitcount += (8 * (ii - 1));

	/* write out last odd nybble, if present */
	if (kk != n) output_nybble(outfile, (int) array[n - 1]); 

	return; 
}